

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::PointerBuilder::initList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          ElementCount elementCount)

{
  ElementCount elementCount_local;
  ElementSize elementSize_local;
  PointerBuilder *this_local;
  
  WireHelpers::initListPointer
            (__return_storage_ptr__,this->pointer,this->segment,this->capTable,elementCount,
             elementSize,(BuilderArena *)0x0);
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initList(ElementSize elementSize, ElementCount elementCount) {
  return WireHelpers::initListPointer(pointer, segment, capTable, elementCount, elementSize);
}